

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O3

int PGSStreamReader::calcFpsIndex(double fps)

{
  int i;
  long lVar1;
  undefined4 *puVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  ostringstream ss;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  ostringstream local_190 [376];
  
  pdVar3 = pgs_frame_rates;
  lVar1 = 0;
  do {
    dVar5 = *pdVar3 - fps;
    uVar4 = -(ulong)(dVar5 < -dVar5);
    if ((double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4) < 0.0001) {
      return (int)lVar1;
    }
    lVar1 = lVar1 + 1;
    pdVar3 = pdVar3 + 1;
  } while (lVar1 != 0x10);
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Non standard fps value are not supported for PGS streams",0x38);
  puVar2 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar2 = 3;
  *(undefined4 **)(puVar2 + 2) = puVar2 + 6;
  if (local_1b0 == &local_1a0) {
    *(ulong *)(puVar2 + 6) = CONCAT71(uStack_19f,local_1a0);
    *(undefined8 *)(puVar2 + 8) = uStack_198;
  }
  else {
    *(undefined1 **)(puVar2 + 2) = local_1b0;
    *(ulong *)(puVar2 + 6) = CONCAT71(uStack_19f,local_1a0);
  }
  *(undefined8 *)(puVar2 + 4) = local_1a8;
  local_1a0 = 0;
  __cxa_throw(puVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

int PGSStreamReader::calcFpsIndex(const double fps)
{
    for (int i = 0; i < 16; i++)
        if (fabs(pgs_frame_rates[i] - fps) < 1e-4)
            return i;
    THROW(ERR_COMMON, "Non standard fps value are not supported for PGS streams")
}